

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

VectorSet *
AlphaVectorPlanning::ValueFunctionToVectorSet
          (VectorSet *__return_storage_ptr__,ValueFunctionPOMDPDiscrete *V)

{
  pointer pAVar1;
  uint uVar2;
  long lVar3;
  VectorSet *VS;
  ulong uVar4;
  ulong uVar5;
  ulong size2;
  double dVar6;
  
  pAVar1 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pAVar1;
  if (lVar3 == 0) {
    (__return_storage_ptr__->data_).size_ = 0;
    (__return_storage_ptr__->data_).data_ = (pointer)0x0;
    __return_storage_ptr__->size1_ = 0;
    __return_storage_ptr__->size2_ = 0;
  }
  else {
    size2 = (ulong)((long)*(pointer *)
                           ((long)&(pAVar1->_m_values).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl + 8)
                   - *(long *)&(pAVar1->_m_values).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data) >> 3 & 0xffffffff;
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::matrix(__return_storage_ptr__,lVar3 / 0x28,size2);
    uVar2 = 0;
    while( true ) {
      uVar4 = (ulong)uVar2;
      if (((long)(V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                super__Vector_impl_data._M_start) / 0x28 == uVar4) break;
      for (uVar5 = 0; size2 != uVar5; uVar5 = uVar5 + 1) {
        dVar6 = AlphaVector::GetValue
                          ((V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>).
                           _M_impl.super__Vector_impl_data._M_start + uVar4,(Index)uVar5);
        *(double *)
         ((long)(__return_storage_ptr__->data_).data_ +
         uVar5 * 8 + __return_storage_ptr__->size2_ * uVar4 * 8) = dVar6;
      }
      uVar2 = uVar2 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

VectorSet AlphaVectorPlanning::ValueFunctionToVectorSet(const ValueFunctionPOMDPDiscrete& V)
{
    if(V.size()==0)
        return(VectorSet());
    else
    {
        size_t nrS=V[0].GetNrValues();
        VectorSet VS(V.size(),nrS);
        for(Index i=0;i!=V.size();++i)
            for(Index s=0;s!=nrS;++s)
                VS(i,s)=V[i].GetValue(s);
        return(VS);
    }
}